

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_resize2.h
# Opt level: O1

void stbir__encode_first_scanline_from_scatter
               (stbir__info *stbir_info,stbir__per_split_info *split_info)

{
  float *pfVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  
  if (split_info->ring_buffer_begin_index < stbir_info->ring_buffer_num_entries) {
    pfVar1 = split_info->ring_buffer;
    lVar4 = (long)stbir_info->ring_buffer_length_bytes * (long)split_info->ring_buffer_begin_index;
    stbir__encode_scanline
              (stbir_info,
               (void *)((long)stbir_info->output_stride_bytes *
                        (long)split_info->ring_buffer_first_scanline + (long)stbir_info->output_data
                       ),(float *)((long)pfVar1 + lVar4),split_info->ring_buffer_first_scanline);
    *(float *)((long)pfVar1 + lVar4) = 3e+38;
    split_info->ring_buffer_first_scanline = split_info->ring_buffer_first_scanline + 1;
    iVar2 = split_info->ring_buffer_begin_index + 1;
    split_info->ring_buffer_begin_index = iVar2;
    iVar3 = 0;
    if (iVar2 != stbir_info->ring_buffer_num_entries) {
      iVar3 = iVar2;
    }
    split_info->ring_buffer_begin_index = iVar3;
    return;
  }
  __assert_fail("index < stbir_info->ring_buffer_num_entries",
                "/workspace/llm4binary/github/license_c_cmakelists/RobLoach[P]raylib-cpp/build_O1/_deps/raylib-src/src/external/stb_image_resize2.h"
                ,0x1808,
                "float *stbir__get_ring_buffer_entry(const stbir__info *, const stbir__per_split_info *, int)"
               );
}

Assistant:

static void stbir__encode_first_scanline_from_scatter(stbir__info const * stbir_info, stbir__per_split_info* split_info)
{
  // evict a scanline out into the output buffer
  float* ring_buffer_entry = stbir__get_ring_buffer_entry(stbir_info, split_info, split_info->ring_buffer_begin_index );

  // dump the scanline out
  stbir__encode_scanline( stbir_info, ( (char *)stbir_info->output_data ) + ( (size_t)split_info->ring_buffer_first_scanline * (size_t)stbir_info->output_stride_bytes ), ring_buffer_entry, split_info->ring_buffer_first_scanline  STBIR_ONLY_PROFILE_SET_SPLIT_INFO );

  // mark it as empty
  ring_buffer_entry[ 0 ] = STBIR__FLOAT_EMPTY_MARKER;

  // advance the first scanline
  split_info->ring_buffer_first_scanline++;
  if ( ++split_info->ring_buffer_begin_index == stbir_info->ring_buffer_num_entries )
    split_info->ring_buffer_begin_index = 0;
}